

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

FoldingSetBase * __thiscall
llvm::FoldingSetBase::operator=(FoldingSetBase *this,FoldingSetBase *RHS)

{
  FoldingSetBase *RHS_local;
  FoldingSetBase *this_local;
  
  free(this->Buckets);
  this->Buckets = RHS->Buckets;
  this->NumBuckets = RHS->NumBuckets;
  this->NumNodes = RHS->NumNodes;
  RHS->Buckets = (void **)0x0;
  RHS->NumBuckets = 0;
  RHS->NumNodes = 0;
  return this;
}

Assistant:

FoldingSetBase &FoldingSetBase::operator=(FoldingSetBase &&RHS) {
  free(Buckets); // This may be null if the set is in a moved-from state.
  Buckets = RHS.Buckets;
  NumBuckets = RHS.NumBuckets;
  NumNodes = RHS.NumNodes;
  RHS.Buckets = nullptr;
  RHS.NumBuckets = 0;
  RHS.NumNodes = 0;
  return *this;
}